

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_value * mg_value_make_point_2d(mg_point_2d *point_2d)

{
  mg_value *pmVar1;
  
  pmVar1 = (mg_value *)mg_allocator_malloc(&mg_system_allocator,0x10);
  if (pmVar1 != (mg_value *)0x0) {
    pmVar1->type = MG_VALUE_TYPE_POINT_2D;
    (pmVar1->field_1).point_2d_v = point_2d;
  }
  return pmVar1;
}

Assistant:

mg_value *mg_value_make_point_2d(mg_point_2d *point_2d) {
  mg_value *value = mg_allocator_malloc(&mg_system_allocator, sizeof(mg_value));
  if (!value) {
    return NULL;
  }
  value->type = MG_VALUE_TYPE_POINT_2D;
  value->point_2d_v = point_2d;
  return value;
}